

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

IndexType GetIndexTypeFromString
                    (char16 *propertyName,charcount_t propertyLength,ScriptContext *scriptContext,
                    uint32 *index,PropertyRecord **propertyRecord,bool createIfNotFound)

{
  BOOL BVar1;
  IndexType IVar2;
  
  BVar1 = Js::NumberUtilities::TryConvertToUInt32(propertyName,propertyLength,index);
  if ((BVar1 == 0) || (IVar2 = IndexType_Number, *index == 0xffffffff)) {
    if (createIfNotFound) {
      Js::ScriptContext::GetOrAddPropertyRecord
                (scriptContext,propertyName,propertyLength,propertyRecord);
    }
    else {
      Js::ScriptContext::FindPropertyRecord
                (scriptContext,propertyName,propertyLength,propertyRecord);
    }
    IVar2 = IndexType_PropertyId;
  }
  return IVar2;
}

Assistant:

IndexType GetIndexTypeFromString(char16 const * propertyName, charcount_t propertyLength, ScriptContext* scriptContext, uint32* index, PropertyRecord const** propertyRecord, bool createIfNotFound)
    {
        if (JavascriptOperators::TryConvertToUInt32(propertyName, propertyLength, index) &&
            (*index != JavascriptArray::InvalidIndex))
        {
            return IndexType_Number;
        }
        else
        {
            if (createIfNotFound)
            {
                scriptContext->GetOrAddPropertyRecord(propertyName, propertyLength, propertyRecord);
            }
            else
            {
                scriptContext->FindPropertyRecord(propertyName, propertyLength, propertyRecord);
            }
            return IndexType_PropertyId;
        }
    }